

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3rbu * sqlite3rbu_vacuum(char *zTarget,char *zState)

{
  bool bVar1;
  sqlite3rbu *psVar2;
  
  if (zTarget == (char *)0x0) {
    psVar2 = rbuMisuseError();
    return psVar2;
  }
  if (zState != (char *)0x0) {
    psVar2 = (sqlite3rbu *)strlen(zState);
    bVar1 = true;
    if ((6 < (int)psVar2) &&
       (psVar2 = (sqlite3rbu *)(ulong)((int)psVar2 - 7),
       *(int *)(zState + 3 + (long)psVar2) == 0x706d7463 &&
       *(int *)(zState + (long)psVar2) == 0x6361762d)) {
      bVar1 = false;
      psVar2 = rbuMisuseError();
    }
    if (!bVar1) {
      return psVar2;
    }
  }
  psVar2 = openRbuHandle((char *)0x0,zTarget,zState);
  return psVar2;
}

Assistant:

SQLITE_API sqlite3rbu *sqlite3rbu_vacuum(
  const char *zTarget, 
  const char *zState
){
  if( zTarget==0 ){ return rbuMisuseError(); }
  if( zState ){
    int n = strlen(zState);
    if( n>=7 && 0==memcmp("-vactmp", &zState[n-7], 7) ){
      return rbuMisuseError();
    }
  }
  /* TODO: Check that both arguments are non-NULL */
  return openRbuHandle(0, zTarget, zState);
}